

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_int,unsigned_int_const&,char_const(&)[14],int>
          (ValidationContext *this,IssueError *issue,uint *args,uint *args_1,uint *args_2,
          char (*args_3) [14],int *args_4)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  uint *in_RCX;
  v10 *in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  uint *in_R8;
  uint *in_R9;
  char (*in_stack_00000008) [14];
  undefined1 in_stack_00000078 [16];
  string_view in_stack_00000088;
  ValidationReport *__args;
  string *psVar2;
  char *pcVar3;
  undefined8 local_1c8;
  allocator<char> *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  allocator<char> local_1a1;
  undefined1 local_1a0;
  undefined2 local_19e;
  char local_198 [32];
  undefined1 auStack_178 [48];
  uint *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int,_char[14],_int>
  local_128;
  undefined8 local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int,_char[14],_int>
  *local_c8;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  v10 *local_90;
  undefined8 local_88 [2];
  ValidationReport *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int,_char[14],_int>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int,_char[14],_int>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int,_char[14],_int>
  *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  auStack_178._32_8_ = in_R9;
  auStack_178._40_8_ = in_R8;
  local_148 = in_RCX;
  local_140._M_allocated_capacity = (size_type)in_RDX;
  local_140._8_8_ = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  psVar2 = &in_RDI->message;
  local_1a0 = *(undefined1 *)local_140._8_8_;
  local_19e = *(undefined2 *)(local_140._8_8_ + 2);
  pcVar3 = local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  __args = (ValidationReport *)auStack_178;
  local_60 = (undefined8 *)(local_140._8_8_ + 0x18);
  local_58 = &local_1c8;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(local_140._8_8_ + 0x20);
  s._M_str = pcVar3;
  s._M_len = (size_t)psVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_RDI,s);
  local_8 = local_60;
  local_88[0] = local_1c8;
  local_90 = (v10 *)local_140._M_allocated_capacity;
  local_98 = local_148;
  local_a0 = (uint *)auStack_178._40_8_;
  local_a8 = (uint *)auStack_178._32_8_;
  local_50 = local_88;
  local_78 = __args;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int,unsigned_int_const,char_const[14],int>
            (&local_128,(v10 *)local_140._M_allocated_capacity,local_148,(uint *)auStack_178._40_8_,
             (uint *)auStack_178._32_8_,in_stack_00000008,(int *)__args);
  local_30 = &local_d0;
  local_38 = &local_128;
  local_20 = 0x1c222;
  local_d0 = 0x1c222;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_c8 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_00000088,(format_args)in_stack_00000078);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_RDI,__args);
  ValidationReport::~ValidationReport(in_RDI);
  std::allocator<char>::~allocator(&local_1a1);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }